

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall
kj::anon_unknown_59::InMemoryDirectory::SymlinkNode::parse
          (Path *__return_storage_ptr__,SymlinkNode *this)

{
  size_t sVar1;
  char *pcVar2;
  StringPtr path;
  anon_class_8_1_8991fb9c _kjContextFunc1447;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:1447:7)>
  _kjContext1447;
  SymlinkNode *local_78;
  Context local_70;
  undefined1 *local_28;
  
  local_78 = this;
  _::Debug::Context::Context(&local_70);
  local_70.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_00260088;
  sVar1 = (this->content).content.size_;
  if (sVar1 == 0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = (this->content).content.ptr;
  }
  path.content.size_ = sVar1 + (sVar1 == 0);
  path.content.ptr = pcVar2;
  local_28 = (undefined1 *)&local_78;
  Path::parse(__return_storage_ptr__,path);
  _::Debug::Context::~Context(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Path parse() const {
      KJ_CONTEXT("parsing symlink", content);
      return Path::parse(content);
    }